

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcparam.c
# Opt level: O0

void jpeg_set_colorspace(j_compress_ptr cinfo,J_COLOR_SPACE colorspace)

{
  undefined4 *puVar1;
  long lVar2;
  int *piVar3;
  undefined4 in_ESI;
  long *in_RDI;
  int ci;
  jpeg_component_info *compptr;
  int local_1c;
  
  if (*(int *)((long)in_RDI + 0x24) != 100) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x15;
    *(undefined4 *)(*in_RDI + 0x2c) = *(undefined4 *)((long)in_RDI + 0x24);
    (**(code **)*in_RDI)(in_RDI);
  }
  *(undefined4 *)(in_RDI + 0xc) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0x144) = 0;
  *(undefined4 *)(in_RDI + 0x2a) = 0;
  switch(in_ESI) {
  case 0:
    *(int *)((long)in_RDI + 0x5c) = (int)in_RDI[7];
    if ((*(int *)((long)in_RDI + 0x5c) < 1) || (10 < *(int *)((long)in_RDI + 0x5c))) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x1b;
      *(undefined4 *)(*in_RDI + 0x2c) = *(undefined4 *)((long)in_RDI + 0x5c);
      *(undefined4 *)(*in_RDI + 0x30) = 10;
      (**(code **)*in_RDI)(in_RDI);
    }
    for (local_1c = 0; local_1c < *(int *)((long)in_RDI + 0x5c); local_1c = local_1c + 1) {
      piVar3 = (int *)(in_RDI[0xd] + (long)local_1c * 0x60);
      *piVar3 = local_1c;
      piVar3[2] = 1;
      piVar3[3] = 1;
      piVar3[4] = 0;
      piVar3[5] = 0;
      piVar3[6] = 0;
    }
    break;
  case 1:
    *(undefined4 *)((long)in_RDI + 0x144) = 1;
    *(undefined4 *)((long)in_RDI + 0x5c) = 1;
    puVar1 = (undefined4 *)in_RDI[0xd];
    *puVar1 = 1;
    puVar1[2] = 1;
    puVar1[3] = 1;
    puVar1[4] = 0;
    puVar1[5] = 0;
    puVar1[6] = 0;
    break;
  case 2:
    *(undefined4 *)(in_RDI + 0x2a) = 1;
    *(undefined4 *)((long)in_RDI + 0x5c) = 3;
    puVar1 = (undefined4 *)in_RDI[0xd];
    *puVar1 = 0x52;
    puVar1[2] = 1;
    puVar1[3] = 1;
    puVar1[4] = 0;
    puVar1[5] = 0;
    puVar1[6] = 0;
    lVar2 = in_RDI[0xd];
    *(undefined4 *)(lVar2 + 0x60) = 0x47;
    *(undefined4 *)(lVar2 + 0x68) = 1;
    *(undefined4 *)(lVar2 + 0x6c) = 1;
    *(undefined4 *)(lVar2 + 0x70) = 0;
    *(undefined4 *)(lVar2 + 0x74) = 0;
    *(undefined4 *)(lVar2 + 0x78) = 0;
    lVar2 = in_RDI[0xd];
    *(undefined4 *)(lVar2 + 0xc0) = 0x42;
    *(undefined4 *)(lVar2 + 200) = 1;
    *(undefined4 *)(lVar2 + 0xcc) = 1;
    *(undefined4 *)(lVar2 + 0xd0) = 0;
    *(undefined4 *)(lVar2 + 0xd4) = 0;
    *(undefined4 *)(lVar2 + 0xd8) = 0;
    break;
  case 3:
    *(undefined4 *)((long)in_RDI + 0x144) = 1;
    *(undefined4 *)((long)in_RDI + 0x5c) = 3;
    puVar1 = (undefined4 *)in_RDI[0xd];
    *puVar1 = 1;
    puVar1[2] = 2;
    puVar1[3] = 2;
    puVar1[4] = 0;
    puVar1[5] = 0;
    puVar1[6] = 0;
    lVar2 = in_RDI[0xd];
    *(undefined4 *)(lVar2 + 0x60) = 2;
    *(undefined4 *)(lVar2 + 0x68) = 1;
    *(undefined4 *)(lVar2 + 0x6c) = 1;
    *(undefined4 *)(lVar2 + 0x70) = 1;
    *(undefined4 *)(lVar2 + 0x74) = 1;
    *(undefined4 *)(lVar2 + 0x78) = 1;
    lVar2 = in_RDI[0xd];
    *(undefined4 *)(lVar2 + 0xc0) = 3;
    *(undefined4 *)(lVar2 + 200) = 1;
    *(undefined4 *)(lVar2 + 0xcc) = 1;
    *(undefined4 *)(lVar2 + 0xd0) = 1;
    *(undefined4 *)(lVar2 + 0xd4) = 1;
    *(undefined4 *)(lVar2 + 0xd8) = 1;
    break;
  case 4:
    *(undefined4 *)(in_RDI + 0x2a) = 1;
    *(undefined4 *)((long)in_RDI + 0x5c) = 4;
    puVar1 = (undefined4 *)in_RDI[0xd];
    *puVar1 = 0x43;
    puVar1[2] = 1;
    puVar1[3] = 1;
    puVar1[4] = 0;
    puVar1[5] = 0;
    puVar1[6] = 0;
    lVar2 = in_RDI[0xd];
    *(undefined4 *)(lVar2 + 0x60) = 0x4d;
    *(undefined4 *)(lVar2 + 0x68) = 1;
    *(undefined4 *)(lVar2 + 0x6c) = 1;
    *(undefined4 *)(lVar2 + 0x70) = 0;
    *(undefined4 *)(lVar2 + 0x74) = 0;
    *(undefined4 *)(lVar2 + 0x78) = 0;
    lVar2 = in_RDI[0xd];
    *(undefined4 *)(lVar2 + 0xc0) = 0x59;
    *(undefined4 *)(lVar2 + 200) = 1;
    *(undefined4 *)(lVar2 + 0xcc) = 1;
    *(undefined4 *)(lVar2 + 0xd0) = 0;
    *(undefined4 *)(lVar2 + 0xd4) = 0;
    *(undefined4 *)(lVar2 + 0xd8) = 0;
    lVar2 = in_RDI[0xd];
    *(undefined4 *)(lVar2 + 0x120) = 0x4b;
    *(undefined4 *)(lVar2 + 0x128) = 1;
    *(undefined4 *)(lVar2 + 300) = 1;
    *(undefined4 *)(lVar2 + 0x130) = 0;
    *(undefined4 *)(lVar2 + 0x134) = 0;
    *(undefined4 *)(lVar2 + 0x138) = 0;
    break;
  case 5:
    *(undefined4 *)(in_RDI + 0x2a) = 1;
    *(undefined4 *)((long)in_RDI + 0x5c) = 4;
    puVar1 = (undefined4 *)in_RDI[0xd];
    *puVar1 = 1;
    puVar1[2] = 2;
    puVar1[3] = 2;
    puVar1[4] = 0;
    puVar1[5] = 0;
    puVar1[6] = 0;
    lVar2 = in_RDI[0xd];
    *(undefined4 *)(lVar2 + 0x60) = 2;
    *(undefined4 *)(lVar2 + 0x68) = 1;
    *(undefined4 *)(lVar2 + 0x6c) = 1;
    *(undefined4 *)(lVar2 + 0x70) = 1;
    *(undefined4 *)(lVar2 + 0x74) = 1;
    *(undefined4 *)(lVar2 + 0x78) = 1;
    lVar2 = in_RDI[0xd];
    *(undefined4 *)(lVar2 + 0xc0) = 3;
    *(undefined4 *)(lVar2 + 200) = 1;
    *(undefined4 *)(lVar2 + 0xcc) = 1;
    *(undefined4 *)(lVar2 + 0xd0) = 1;
    *(undefined4 *)(lVar2 + 0xd4) = 1;
    *(undefined4 *)(lVar2 + 0xd8) = 1;
    lVar2 = in_RDI[0xd];
    *(undefined4 *)(lVar2 + 0x120) = 4;
    *(undefined4 *)(lVar2 + 0x128) = 2;
    *(undefined4 *)(lVar2 + 300) = 2;
    *(undefined4 *)(lVar2 + 0x130) = 0;
    *(undefined4 *)(lVar2 + 0x134) = 0;
    *(undefined4 *)(lVar2 + 0x138) = 0;
    break;
  default:
    *(undefined4 *)(*in_RDI + 0x28) = 0xb;
    (**(code **)*in_RDI)(in_RDI);
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_set_colorspace (j_compress_ptr cinfo, J_COLOR_SPACE colorspace)
{
  jpeg_component_info * compptr;
  int ci;

#define SET_COMP(index,id,hsamp,vsamp,quant,dctbl,actbl)  \
  (compptr = &cinfo->comp_info[index], \
   compptr->component_id = (id), \
   compptr->h_samp_factor = (hsamp), \
   compptr->v_samp_factor = (vsamp), \
   compptr->quant_tbl_no = (quant), \
   compptr->dc_tbl_no = (dctbl), \
   compptr->ac_tbl_no = (actbl) )

  /* Safety check to ensure start_compress not called yet. */
  if (cinfo->global_state != CSTATE_START)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  /* For all colorspaces, we use Q and Huff tables 0 for luminance components,
   * tables 1 for chrominance components.
   */

  cinfo->jpeg_color_space = colorspace;

  cinfo->write_JFIF_header = FALSE; /* No marker for non-JFIF colorspaces */
  cinfo->write_Adobe_marker = FALSE; /* write no Adobe marker by default */

  switch (colorspace) {
  case JCS_GRAYSCALE:
    cinfo->write_JFIF_header = TRUE; /* Write a JFIF marker */
    cinfo->num_components = 1;
    /* JFIF specifies component ID 1 */
    SET_COMP(0, 1, 1,1, 0, 0,0);
    break;
  case JCS_RGB:
    cinfo->write_Adobe_marker = TRUE; /* write Adobe marker to flag RGB */
    cinfo->num_components = 3;
    SET_COMP(0, 0x52 /* 'R' */, 1,1, 0, 0,0);
    SET_COMP(1, 0x47 /* 'G' */, 1,1, 0, 0,0);
    SET_COMP(2, 0x42 /* 'B' */, 1,1, 0, 0,0);
    break;
  case JCS_YCbCr:
    cinfo->write_JFIF_header = TRUE; /* Write a JFIF marker */
    cinfo->num_components = 3;
    /* JFIF specifies component IDs 1,2,3 */
    /* We default to 2x2 subsamples of chrominance */
    SET_COMP(0, 1, 2,2, 0, 0,0);
    SET_COMP(1, 2, 1,1, 1, 1,1);
    SET_COMP(2, 3, 1,1, 1, 1,1);
    break;
  case JCS_CMYK:
    cinfo->write_Adobe_marker = TRUE; /* write Adobe marker to flag CMYK */
    cinfo->num_components = 4;
    SET_COMP(0, 0x43 /* 'C' */, 1,1, 0, 0,0);
    SET_COMP(1, 0x4D /* 'M' */, 1,1, 0, 0,0);
    SET_COMP(2, 0x59 /* 'Y' */, 1,1, 0, 0,0);
    SET_COMP(3, 0x4B /* 'K' */, 1,1, 0, 0,0);
    break;
  case JCS_YCCK:
    cinfo->write_Adobe_marker = TRUE; /* write Adobe marker to flag YCCK */
    cinfo->num_components = 4;
    SET_COMP(0, 1, 2,2, 0, 0,0);
    SET_COMP(1, 2, 1,1, 1, 1,1);
    SET_COMP(2, 3, 1,1, 1, 1,1);
    SET_COMP(3, 4, 2,2, 0, 0,0);
    break;
  case JCS_UNKNOWN:
    cinfo->num_components = cinfo->input_components;
    if (cinfo->num_components < 1 || cinfo->num_components > MAX_COMPONENTS)
      ERREXIT2(cinfo, JERR_COMPONENT_COUNT, cinfo->num_components,
	       MAX_COMPONENTS);
    for (ci = 0; ci < cinfo->num_components; ci++) {
      SET_COMP(ci, ci, 1,1, 0, 0,0);
    }
    break;
  default:
    ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
  }
}